

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O3

void __thiscall
fakeit::MethodMockingContext<unsigned_long>::Implementation::setMethodDetails
          (Implementation *this,string *mockName,string *methodName)

{
  Context *pCVar1;
  pointer pcVar2;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  pCVar1 = this->_stubbingContext;
  pcVar2 = (mockName->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + mockName->_M_string_length);
  pcVar2 = (methodName->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + methodName->_M_string_length);
  (*(pCVar1->super_Destructible)._vptr_Destructible[6])(pCVar1,local_40,local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void setMethodDetails(std::string mockName, std::string methodName) {
                getStubbingContext().setMethodDetails(mockName, methodName);
            }